

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void VW::finish_example(vw *all,example *ec)

{
  int iVar1;
  pair<example_*,_example_*> *bound;
  pointer ppVar2;
  mutex *__mutex;
  
  ppVar2 = (all->p->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar2 == (all->p->example_pool).m_chunk_bounds.
                  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if ((ppVar2->first <= ec) && (ec <= ppVar2->second)) break;
    ppVar2 = ppVar2 + 1;
  }
  empty_example(all,ec);
  ec->in_use = false;
  object_pool<example,_example_initializer>::return_object(&all->p->example_pool,ec);
  __mutex = &all->p->output_lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool is_ring_example(vw& all, example* ae) { return all.p->example_pool.is_from_pool(ae); }